

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipgraph.h
# Opt level: O0

BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_> * __thiscall
libDAI::BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_>::operator=
          (BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_> *this,
          BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_> *x)

{
  BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_> *in_RSI;
  BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_> *in_RDI;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *in_stack_00000088;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *in_stack_00000090;
  
  if (in_RDI != in_RSI) {
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator=
              ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)in_stack_00000090,
               (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)in_stack_00000088);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator=
              (in_stack_00000090,in_stack_00000088);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)in_stack_00000090,
                (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)in_stack_00000088);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator=((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)in_stack_00000090,
                (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)in_stack_00000088);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator=((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)in_stack_00000090,
                (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)in_stack_00000088);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator=((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)in_stack_00000090,
                (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)in_stack_00000088);
  }
  return in_RDI;
}

Assistant:

BipartiteGraph<T1,T2> & operator=(const BipartiteGraph<T1,T2> & x) {
                if( this != &x ) {
                    _V1 =       x._V1;
                    _V2 =       x._V2;
                    _E12 =      x._E12;
                    _E12ind =   x._E12ind;
                    _nb1 =      x._nb1;
                    _nb2 =      x._nb2;
                }
                return *this;
            }